

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall
nuraft::asio_rpc_listener::handle_accept
          (asio_rpc_listener *this,ptr<asio_rpc_listener> *self,ptr<rpc_session> *session,
          error_code *err)

{
  uint uVar1;
  element_type *peVar2;
  int iVar3;
  lock_guard<std::mutex> __mutex;
  lock_guard<std::mutex> guard;
  undefined8 local_48 [4];
  
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (err->_M_value == 0) {
    if (peVar2 != (element_type *)0x0) {
      iVar3 = (*peVar2->_vptr_logger[7])();
      if (3 < iVar3) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)&guard,"receive a incoming rpc connection");
        (*peVar2->_vptr_logger[8])
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"handle_accept",0x344,&guard);
        std::__cxx11::string::~string((string *)&guard);
      }
    }
    rpc_session::prepare_handshake
              ((session->super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              );
  }
  else if (peVar2 != (element_type *)0x0) {
    iVar3 = (*peVar2->_vptr_logger[7])();
    if (1 < iVar3) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar1 = err->_M_value;
      (**(code **)(*(long *)err->_M_cat + 0x20))(local_48,err->_M_cat,uVar1);
      msg_if_given_abi_cxx11_
                ((string *)&guard,"failed to accept a rpc connection due to error %d, %s",
                 (ulong)uVar1,local_48[0]);
      (*peVar2->_vptr_logger[8])
                (peVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"handle_accept",0x349,&guard);
      std::__cxx11::string::~string((string *)&guard);
      std::__cxx11::string::~string((string *)local_48);
    }
  }
  __mutex._M_device = &this->listener_lock_;
  guard._M_device = __mutex._M_device;
  std::mutex::lock(__mutex._M_device);
  if (this->stopped_ == false) {
    start(this,&guard);
    __mutex = guard;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex._M_device);
  return;
}

Assistant:

void handle_accept(ptr<asio_rpc_listener> self,
                       ptr<rpc_session> session,
                       const ERROR_CODE& err)
    {
        if (!err) {
            p_in("receive a incoming rpc connection");
            session->prepare_handshake();

        } else {
            p_er( "failed to accept a rpc connection due to error %d, %s",
                  err.value(), err.message().c_str() );
        }

        std::lock_guard<std::mutex> guard(listener_lock_);
        if (!stopped_) {
            // Re-listen only when not stopped,
            // otherwise crash happens as this class or `acceptor_`
            // may be destroyed in the meantime.
            this->start(guard);
        }
    }